

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# higher_order_functions.c
# Opt level: O2

int fun_zip_add_min_default(int *e1,int *e2,int count)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar2;
  }
  iVar1 = 10000000;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if (((e1[uVar2] != 10000000) && (e2[uVar2] != 10000000)) &&
       (iVar4 = e2[uVar2] + e1[uVar2], iVar4 <= iVar1)) {
      iVar1 = iVar4;
    }
  }
  return iVar1;
}

Assistant:

static int
fun_zip_add_min_default(const int *e1,
                        const int *e2,
                        int       count)
{
  int i;
  int decomp = INF;

  for (i = 0; i < count; i++) {
    if ((e1[i] != INF) && (e2[i] != INF)) {
      const int en = e1[i] + e2[i];
      decomp = MIN2(decomp, en);
    }
  }

  return decomp;
}